

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::elementAccessTest<false>(ViewTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  size_t *psVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_00;
  reference piVar2;
  int *piVar3;
  int *data;
  size_t j;
  int iVar4;
  int iVar5;
  size_t y_1;
  int y_7;
  int y_6;
  size_t y;
  unsigned_long uVar6;
  unsigned_long args_1;
  long lVar7;
  int iVar8;
  size_t x;
  size_t sVar9;
  allocator_type local_b9;
  int *local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> w;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 6;
  begin._M_current[1] = 4;
  local_b8 = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b8,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&w);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&w,2,&local_b9);
  for (sVar9 = 0; sVar9 != 6; sVar9 = sVar9 + 1) {
    for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
      *(size_t *)
       CONCAT71(w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start._1_7_,
                w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start._0_1_) = sVar9;
      ((size_t *)
      CONCAT71(w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start._1_7_,
               w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start._0_1_))[1] = uVar6;
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar9,uVar6);
      iVar4 = *piVar2;
      it._M_current._1_7_ =
           w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._1_7_;
      it._M_current._0_1_ =
           w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start._0_1_;
      piVar2 = andres::marray_detail::AccessOperatorHelper<false>::
               execute<int,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,false,std::allocator<unsigned_long>>
                         (&v,it);
      local_b9 = (allocator_type)(iVar4 == *piVar2);
      test((bool *)&local_b9);
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_00._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 3;
  begin_00._M_current[1] = 4;
  begin_00._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b8,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&w);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&w,3,&local_b9);
  for (sVar9 = 0; sVar9 != 3; sVar9 = sVar9 + 1) {
    for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
      for (args_1 = 0; args_1 != 2; args_1 = args_1 + 1) {
        psVar1 = (size_t *)
                 CONCAT71(w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start._0_1_);
        *psVar1 = sVar9;
        psVar1[1] = uVar6;
        psVar1[2] = args_1;
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar9,uVar6,args_1);
        iVar4 = *piVar2;
        it_00._M_current._1_7_ =
             w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start._1_7_;
        it_00._M_current._0_1_ =
             w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start._0_1_;
        piVar2 = andres::marray_detail::AccessOperatorHelper<false>::
                 execute<int,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,false,std::allocator<unsigned_long>>
                           (&v,it_00);
        local_b9 = (allocator_type)(iVar4 == *piVar2);
        test((bool *)&local_b9);
      }
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&v,&this->scalar_,(allocator_type *)&shape);
  piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = *piVar2 == 0x2a;
  test((bool *)&shape);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            (&v,&this->scalar_,(allocator_type *)&shape);
  piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = *piVar2 == 0x2a;
  test((bool *)&shape);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_01._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b8,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&w);
  for (sVar9 = 0; sVar9 != 0x18; sVar9 = sVar9 + 1) {
    piVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,sVar9);
    w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar2 == local_b8[sVar9];
    test((bool *)&w);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin_02._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_02._M_current = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b8,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&w);
  for (sVar9 = 0; sVar9 != 0x18; sVar9 = sVar9 + 1) {
    piVar2 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()(&v,sVar9);
    w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar2 == local_b8[sVar9];
    test((bool *)&w);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_03._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_03._M_current = 4;
  begin_03._M_current[1] = 6;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b8,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&w);
  lVar7 = 0;
  for (iVar4 = 0; piVar3 = local_b8, iVar4 != 6; iVar4 = iVar4 + 1) {
    for (sVar9 = 0; sVar9 != 4; sVar9 = sVar9 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar9,iVar4);
      w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = *piVar2 == piVar3[(long)(int)lVar7 + sVar9];
      test((bool *)&w);
    }
    lVar7 = (long)(int)lVar7 + 4;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_04._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_04._M_current = 4;
  begin_04._M_current[1] = 6;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b8,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&w);
  lVar7 = 0;
  for (iVar4 = 0; piVar3 = local_b8, iVar4 != 6; iVar4 = iVar4 + 1) {
    for (sVar9 = 0; sVar9 != 4; sVar9 = sVar9 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar9,iVar4);
      w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = *piVar2 == piVar3[(long)(int)lVar7 + sVar9];
      test((bool *)&w);
    }
    lVar7 = (long)(int)lVar7 + 4;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_05._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 3;
  begin_05._M_current[1] = 4;
  begin_05._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b8,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&w);
  iVar4 = 0;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (iVar8 = 0; piVar3 = local_b8, iVar8 != 4; iVar8 = iVar8 + 1) {
      for (sVar9 = 0; sVar9 != 3; sVar9 = sVar9 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar9,iVar8,iVar5);
        w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = *piVar2 == piVar3[(long)iVar4 + sVar9];
        test((bool *)&w);
      }
      iVar4 = iVar4 + 3;
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_06._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_06._M_current = 3;
  begin_06._M_current[1] = 4;
  begin_06._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,local_b8,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&w);
  iVar4 = 0;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (iVar8 = 0; piVar3 = local_b8, iVar8 != 4; iVar8 = iVar8 + 1) {
      for (sVar9 = 0; sVar9 != 3; sVar9 = sVar9 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar9,iVar8,iVar5);
        w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = *piVar2 == piVar3[(long)iVar4 + sVar9];
        test((bool *)&w);
      }
      iVar4 = iVar4 + 3;
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,4,(allocator_type *)&v);
  begin_07._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_07._M_current = 3;
  begin_07._M_current[1] = 4;
  begin_07._M_current[2] = 2;
  begin_07._M_current[3] = 2;
  data = this->data100_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  piVar3 = (int *)0x0;
  for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
    for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
      for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
        local_b8 = piVar3;
        for (sVar9 = 0; sVar9 != 3; sVar9 = sVar9 + 1) {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar9,iVar8,iVar5,
                              iVar4);
          w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = *piVar2 == data[(long)(int)piVar3 + sVar9];
          test((bool *)&w);
        }
        piVar3 = (int *)(ulong)((int)local_b8 + 3);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,4,(allocator_type *)&v);
  begin_08._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_08._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_08._M_current = 3;
  begin_08._M_current[1] = 4;
  begin_08._M_current[2] = 2;
  begin_08._M_current[3] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  piVar3 = (int *)0x0;
  for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
    for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
      for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
        local_b8 = piVar3;
        for (sVar9 = 0; sVar9 != 3; sVar9 = sVar9 + 1) {
          piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar9,iVar8,iVar5,
                              iVar4);
          w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = *piVar2 == data[(long)(int)piVar3 + sVar9];
          test((bool *)&w);
        }
        piVar3 = (int *)(ulong)((int)local_b8 + 3);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::elementAccessTest(){
    // element access by coordinate
    {
        // 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> w(2);
        
            for(std::size_t x=0; x<6; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    w[0] = x;
                    w[1] = y;
                    test(v(x, y) == v(w.begin()));
                }
            }
        }
        // 3D 
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> w(3);
        
            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        w[0] = x;
                        w[1] = y;
                        w[2] = z; 
                        test(v(x, y, z) == v(w.begin()));
                    }
                }
            }
        }
    }
    // scalar
    {
        {
            andres::View<int, constTarget> v(&scalar_);
            
            test(v(0) == 42);
        }
        // const
        {
            andres::View<int, constTarget> const v(&scalar_);
            
            test(v(0) == 42);
        }
    }
    // 1D 
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            for(std::size_t j=0; j<24; ++j) {
                test(v(j) == data_[j]); 
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            for(std::size_t j=0; j<24; ++j) {
                test(v(j) == data_[j]); 
            }
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 4;
            shape[1] = 6;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int y = 0; y < 6; ++y){
                for(int x = 0; x < 4; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 4;
            shape[1] = 6;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int y = 0; y < 6; ++y){
                for(int x = 0; x < 4; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
    }
    // 3D 
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 4; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
        // const
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 4; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
    }
    // 4D 
    {
        {
            std::vector<std::size_t> shape(4);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            shape[3] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data100_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 4; ++x){
                        for(int w = 0; w < 3; ++w){
                            test(v(w, x, y, z) == data100_[i]);
                            ++i;
                        }
                    }
                }
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(4);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            shape[3] = 2;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data100_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 4; ++x){
                        for(int w = 0; w < 3; ++w){
                            test(v(w, x, y, z) == data100_[i]);
                            ++i;
                        }
                    }
                }
            }
        }
    }
}